

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O1

void __thiscall USBSignalState::AddFrame(USBSignalState *this,USBAnalyzerResults *res)

{
  Frame f;
  U64 local_40;
  U64 local_38;
  ulong local_30;
  undefined8 local_28;
  undefined1 local_20;
  
  Frame::Frame((Frame *)&local_40);
  local_40 = this->mSampleBegin;
  local_38 = this->mSampleEnd;
  local_20 = 0;
  local_30 = (ulong)this->mState;
  local_28 = 0;
  AnalyzerResults::AddFrame((Frame *)res);
  AnalyzerResults::CommitResults();
  Frame::~Frame((Frame *)&local_40);
  return;
}

Assistant:

void USBSignalState::AddFrame( USBAnalyzerResults* res )
{
    Frame f;
    f.mStartingSampleInclusive = mSampleBegin;
    f.mEndingSampleInclusive = mSampleEnd;
    f.mType = FT_Signal;
    f.mData1 = mState;
    f.mData2 = 0;

    res->AddFrame( f );
    res->CommitResults();
}